

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MySEQOutput.h
# Opt level: O0

void MySEQOutput::displayOffset(string *offsetName,DWORD offsetValue)

{
  ostream *poVar1;
  DWORD offsetValue_local;
  string *offsetName_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)offsetName);
  poVar1 = std::operator<<(poVar1,"=0x");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,offsetValue);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void displayOffset(std::string offsetName, DWORD offsetValue)
	{
		std::cout << offsetName << "=0x" << std::hex << offsetValue << std::endl;
	}